

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O0

void highbd_bilinear_filter
               (uint16_t *src,int src_stride,int xoffset,int yoffset,uint16_t *dst,int w,int h)

{
  undefined1 (*pauVar1) [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  __m128i filter;
  __m128i filter_00;
  __m128i b_00;
  __m128i b_01;
  __m128i a;
  __m128i a_00;
  undefined1 auVar6 [16];
  uint uVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  longlong *plVar10;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  undefined2 uVar11;
  undefined2 uVar12;
  undefined2 uVar13;
  undefined8 extraout_XMM0_Qa;
  undefined2 uVar14;
  undefined8 extraout_XMM0_Qa_00;
  undefined2 uVar15;
  undefined2 uVar16;
  undefined2 uVar17;
  undefined8 extraout_XMM0_Qb;
  undefined2 uVar18;
  undefined8 extraout_XMM0_Qb_00;
  __m128i res_1;
  __m128i y_3;
  __m128i x_4;
  __m128i vfilter_vec;
  uint8_t *vfilter;
  __m128i y_2;
  __m128i x_3;
  __m128i res;
  __m128i z_1;
  __m128i y_1;
  __m128i x_2;
  __m128i hfilter_vec;
  uint8_t *hfilter;
  uint16_t *b_2;
  __m128i z;
  __m128i y;
  __m128i x_1;
  uint16_t *b_1;
  __m128i x;
  uint16_t *b;
  int j;
  int i;
  longlong in_stack_fffffffffffffd30;
  longlong in_stack_fffffffffffffd38;
  longlong in_stack_fffffffffffffd40;
  longlong in_stack_fffffffffffffd48;
  longlong lVar19;
  longlong in_stack_fffffffffffffd50;
  longlong lVar20;
  longlong in_stack_fffffffffffffd58;
  long local_220;
  long local_1e0;
  long local_1c8;
  int local_1bc;
  int local_1b8;
  long local_1b0;
  long local_198;
  undefined2 local_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined2 uStack_a0;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 local_98;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  undefined2 local_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined2 uStack_80;
  undefined2 uStack_7e;
  undefined2 uStack_7c;
  undefined2 uStack_7a;
  undefined2 local_78;
  undefined2 uStack_76;
  undefined2 uStack_74;
  undefined2 uStack_72;
  undefined2 uStack_70;
  undefined2 uStack_6e;
  undefined2 uStack_6c;
  undefined2 uStack_6a;
  
  local_198 = in_RDI;
  if (in_EDX == 0) {
    local_1c8 = in_R8;
    for (local_1b8 = 0; local_1b8 < (int)res_1[1] + 1; local_1b8 = local_1b8 + 1) {
      for (local_1bc = 0; local_1bc < in_R9D; local_1bc = local_1bc + 8) {
        puVar8 = (undefined8 *)(local_198 + (long)local_1bc * 2);
        uVar2 = puVar8[1];
        puVar9 = (undefined8 *)(local_1c8 + (long)local_1bc * 2);
        *puVar9 = *puVar8;
        puVar9[1] = uVar2;
      }
      local_198 = local_198 + (long)in_ESI * 2;
      local_1c8 = local_1c8 + (long)in_R9D * 2;
    }
  }
  else if (in_EDX == 4) {
    local_1e0 = in_R8;
    for (local_1b8 = 0; local_1b8 < (int)res_1[1] + 1; local_1b8 = local_1b8 + 1) {
      for (local_1bc = 0; local_1bc < in_R9D; local_1bc = local_1bc + 8) {
        pauVar1 = (undefined1 (*) [16])(local_198 + (long)local_1bc * 2);
        uVar2 = *(undefined8 *)*pauVar1;
        uVar3 = *(undefined8 *)(*pauVar1 + 8);
        auVar6 = *pauVar1;
        puVar8 = (undefined8 *)(local_1e0 + (long)local_1bc * 2);
        local_78 = (undefined2)uVar2;
        uStack_76 = (undefined2)((ulong)uVar2 >> 0x10);
        uStack_74 = (undefined2)((ulong)uVar2 >> 0x20);
        uStack_72 = (undefined2)((ulong)uVar2 >> 0x30);
        uStack_70 = (undefined2)uVar3;
        uStack_6e = (undefined2)((ulong)uVar3 >> 0x10);
        uStack_6c = (undefined2)((ulong)uVar3 >> 0x20);
        uStack_6a = (undefined2)((ulong)uVar3 >> 0x30);
        local_88 = auVar6._2_2_;
        uStack_86 = auVar6._4_2_;
        uStack_84 = auVar6._6_2_;
        uStack_82 = auVar6._8_2_;
        uStack_80 = auVar6._10_2_;
        uStack_7e = auVar6._12_2_;
        uStack_7c = auVar6._14_2_;
        uStack_7a = SUB162(*(undefined1 (*) [16])(local_198 + 0x10 + (long)local_1bc * 2),0);
        uVar11 = pavgw(local_78,local_88);
        uVar12 = pavgw(uStack_76,uStack_86);
        uVar13 = pavgw(uStack_74,uStack_84);
        uVar14 = pavgw(uStack_72,uStack_82);
        uVar15 = pavgw(uStack_70,uStack_80);
        uVar16 = pavgw(uStack_6e,uStack_7e);
        uVar17 = pavgw(uStack_6c,uStack_7c);
        uVar18 = pavgw(uStack_6a,uStack_7a);
        *puVar8 = CONCAT26(uVar14,CONCAT24(uVar13,CONCAT22(uVar12,uVar11)));
        puVar8[1] = CONCAT26(uVar18,CONCAT24(uVar17,CONCAT22(uVar16,uVar15)));
      }
      local_198 = local_198 + (long)in_ESI * 2;
      local_1e0 = local_1e0 + (long)in_R9D * 2;
    }
  }
  else {
    local_220 = in_R8;
    for (local_1b8 = 0; local_1b8 < (int)res_1[1] + 1; local_1b8 = local_1b8 + 1) {
      for (local_1bc = 0; local_1bc < in_R9D; local_1bc = local_1bc + 8) {
        a[1] = in_stack_fffffffffffffd58;
        a[0] = in_stack_fffffffffffffd50;
        b_00[1] = in_stack_fffffffffffffd48;
        b_00[0] = in_stack_fffffffffffffd40;
        filter[1] = in_stack_fffffffffffffd38;
        filter[0] = in_stack_fffffffffffffd30;
        highbd_filter_block(a,b_00,filter);
        puVar8 = (undefined8 *)(local_220 + (long)local_1bc * 2);
        *puVar8 = extraout_XMM0_Qa;
        puVar8[1] = extraout_XMM0_Qb;
      }
      local_220 = local_220 + (long)in_R9D * 2;
    }
  }
  if (in_ECX != 0) {
    local_1b0 = in_R8;
    if (in_ECX == 4) {
      for (local_1b8 = 0; local_1b8 < (int)res_1[1]; local_1b8 = local_1b8 + 1) {
        for (local_1bc = 0; local_1bc < in_R9D; local_1bc = local_1bc + 8) {
          puVar8 = (undefined8 *)(local_1b0 + (long)local_1bc * 2);
          uVar2 = *puVar8;
          uVar3 = puVar8[1];
          puVar8 = (undefined8 *)(local_1b0 + (long)(local_1bc + in_R9D) * 2);
          uVar4 = *puVar8;
          uVar5 = puVar8[1];
          puVar8 = (undefined8 *)(local_1b0 + (long)local_1bc * 2);
          local_98 = (undefined2)uVar2;
          uStack_96 = (undefined2)((ulong)uVar2 >> 0x10);
          uStack_94 = (undefined2)((ulong)uVar2 >> 0x20);
          uStack_92 = (undefined2)((ulong)uVar2 >> 0x30);
          uStack_90 = (undefined2)uVar3;
          uStack_8e = (undefined2)((ulong)uVar3 >> 0x10);
          uStack_8c = (undefined2)((ulong)uVar3 >> 0x20);
          uStack_8a = (undefined2)((ulong)uVar3 >> 0x30);
          local_a8 = (undefined2)uVar4;
          uStack_a6 = (undefined2)((ulong)uVar4 >> 0x10);
          uStack_a4 = (undefined2)((ulong)uVar4 >> 0x20);
          uStack_a2 = (undefined2)((ulong)uVar4 >> 0x30);
          uStack_a0 = (undefined2)uVar5;
          uStack_9e = (undefined2)((ulong)uVar5 >> 0x10);
          uStack_9c = (undefined2)((ulong)uVar5 >> 0x20);
          uStack_9a = (undefined2)((ulong)uVar5 >> 0x30);
          uVar11 = pavgw(local_98,local_a8);
          uVar12 = pavgw(uStack_96,uStack_a6);
          uVar13 = pavgw(uStack_94,uStack_a4);
          uVar14 = pavgw(uStack_92,uStack_a2);
          uVar15 = pavgw(uStack_90,uStack_a0);
          uVar16 = pavgw(uStack_8e,uStack_9e);
          uVar17 = pavgw(uStack_8c,uStack_9c);
          uVar18 = pavgw(uStack_8a,uStack_9a);
          *puVar8 = CONCAT26(uVar14,CONCAT24(uVar13,CONCAT22(uVar12,uVar11)));
          puVar8[1] = CONCAT26(uVar18,CONCAT24(uVar17,CONCAT22(uVar16,uVar15)));
        }
        local_1b0 = local_1b0 + (long)in_R9D * 2;
      }
    }
    else {
      uVar7 = (uint)bilinear_filters_2t[in_ECX][0] | (uint)bilinear_filters_2t[in_ECX][1] << 0x10;
      lVar19 = CONCAT44(uVar7,uVar7);
      lVar20 = CONCAT44(uVar7,uVar7);
      for (local_1b8 = 0; local_1b8 < (int)res_1[1]; local_1b8 = local_1b8 + 1) {
        for (local_1bc = 0; local_1bc < in_R9D; local_1bc = local_1bc + 8) {
          plVar10 = (longlong *)(local_1b0 + (long)local_1bc * 2);
          a_00[1] = in_stack_fffffffffffffd58;
          a_00[0] = lVar20;
          b_01[1] = lVar19;
          b_01[0] = plVar10[1];
          filter_00[1] = *plVar10;
          filter_00[0] = *(longlong *)(local_1b0 + (long)(local_1bc + in_R9D) * 2 + 8);
          highbd_filter_block(a_00,b_01,filter_00);
          puVar8 = (undefined8 *)(local_1b0 + (long)local_1bc * 2);
          *puVar8 = extraout_XMM0_Qa_00;
          puVar8[1] = extraout_XMM0_Qb_00;
        }
        local_1b0 = local_1b0 + (long)in_R9D * 2;
      }
    }
  }
  return;
}

Assistant:

static void highbd_bilinear_filter(const uint16_t *src, int src_stride,
                                   int xoffset, int yoffset, uint16_t *dst,
                                   int w, int h) {
  int i, j;
  // Horizontal filter
  if (xoffset == 0) {
    uint16_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      for (j = 0; j < w; j += 8) {
        __m128i x = _mm_loadu_si128((__m128i *)&src[j]);
        _mm_storeu_si128((__m128i *)&b[j], x);
      }
      src += src_stride;
      b += w;
    }
  } else if (xoffset == 4) {
    uint16_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      for (j = 0; j < w; j += 8) {
        __m128i x = _mm_loadu_si128((__m128i *)&src[j]);
        __m128i y = _mm_loadu_si128((__m128i *)&src[j + 8]);
        __m128i z = _mm_alignr_epi8(y, x, 2);
        _mm_storeu_si128((__m128i *)&b[j], _mm_avg_epu16(x, z));
      }
      src += src_stride;
      b += w;
    }
  } else {
    uint16_t *b = dst;
    const uint8_t *hfilter = bilinear_filters_2t[xoffset];
    const __m128i hfilter_vec = _mm_set1_epi32(hfilter[0] | (hfilter[1] << 16));
    for (i = 0; i < h + 1; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i x = _mm_loadu_si128((__m128i *)&src[j]);
        const __m128i y = _mm_loadu_si128((__m128i *)&src[j + 8]);
        const __m128i z = _mm_alignr_epi8(y, x, 2);
        const __m128i res = highbd_filter_block(x, z, hfilter_vec);
        _mm_storeu_si128((__m128i *)&b[j], res);
      }

      src += src_stride;
      b += w;
    }
  }

  // Vertical filter
  if (yoffset == 0) {
    // The data is already in 'dst', so no need to filter
  } else if (yoffset == 4) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        __m128i x = _mm_loadu_si128((__m128i *)&dst[j]);
        __m128i y = _mm_loadu_si128((__m128i *)&dst[j + w]);
        _mm_storeu_si128((__m128i *)&dst[j], _mm_avg_epu16(x, y));
      }
      dst += w;
    }
  } else {
    const uint8_t *vfilter = bilinear_filters_2t[yoffset];
    const __m128i vfilter_vec = _mm_set1_epi32(vfilter[0] | (vfilter[1] << 16));
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i x = _mm_loadu_si128((__m128i *)&dst[j]);
        const __m128i y = _mm_loadu_si128((__m128i *)&dst[j + w]);
        const __m128i res = highbd_filter_block(x, y, vfilter_vec);
        _mm_storeu_si128((__m128i *)&dst[j], res);
      }

      dst += w;
    }
  }
}